

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

int Session_create(Session_t **handle)

{
  opaque *poVar1;
  ShPtr<HG::SessionImpl> local_18;
  Session_t **local_10;
  Session_t **handle_local;
  
  local_10 = handle;
  make_myshared<HG::SessionImpl>();
  poVar1 = HgHandles::release<HG::SessionImpl>(&local_18);
  *local_10 = poVar1;
  ShPtr<HG::SessionImpl>::~ShPtr(&local_18);
  return 0;
}

Assistant:

int Session_create(Session_t **handle) {
    *handle = HgHandles::release(make_myshared<HG::SessionImpl>());
    return 0;
}